

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_has_extension_nocontext.c
# Opt level: O1

int main(void)

{
  char cVar1;
  char *pcVar2;
  
  dpy = get_display_or_skip();
  cVar1 = epoxy_has_glx_extension(dpy,0,"GLX_ARB_get_proc_address");
  if (cVar1 == '\0') {
    pcVar2 = "Implementation reported absence of GLX_ARB_get_proc_address";
  }
  else {
    cVar1 = epoxy_has_glx_extension(dpy,0,"GLX_ARB_ham_sandwich");
    if (cVar1 == '\0') {
      return 0;
    }
    pcVar2 = "Implementation reported presence of GLX_ARB_ham_sandwich";
  }
  errx(1,pcVar2);
  halt_baddata();
}

Assistant:

int main(void)
{
    bool pass = true;

    dpy = get_display_or_skip();

    if (!epoxy_has_glx_extension(dpy, 0, "GLX_ARB_get_proc_address"))
        errx(1, "Implementation reported absence of GLX_ARB_get_proc_address");

    if (epoxy_has_glx_extension(dpy, 0, "GLX_ARB_ham_sandwich"))
        errx(1, "Implementation reported presence of GLX_ARB_ham_sandwich");

    return pass != true;
}